

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CCtx_params * ZSTD_assignParamsToCCtxParams(ZSTD_CCtx_params cctxParams,ZSTD_parameters params)

{
  ZSTD_CCtx_params *in_RDI;
  ZSTD_CCtx_params *ret;
  
  memcpy(in_RDI,&ret,0x78);
  *(ZSTD_allocFunction *)&in_RDI->cParams = cctxParams.customMem.customAlloc;
  *(ZSTD_freeFunction *)&(in_RDI->cParams).hashLog = cctxParams.customMem.customFree;
  *(void **)&(in_RDI->cParams).searchLength = cctxParams.customMem.opaque;
  (in_RDI->cParams).strategy = params.cParams.windowLog;
  (in_RDI->fParams).contentSizeFlag = params.cParams.chainLog;
  (in_RDI->fParams).checksumFlag = params.cParams.hashLog;
  (in_RDI->fParams).noDictIDFlag = params.cParams.searchLog;
  in_RDI->compressionLevel = 3;
  return in_RDI;
}

Assistant:

static ZSTD_CCtx_params ZSTD_assignParamsToCCtxParams(
        ZSTD_CCtx_params cctxParams, ZSTD_parameters params)
{
    ZSTD_CCtx_params ret = cctxParams;
    ret.cParams = params.cParams;
    ret.fParams = params.fParams;
    ret.compressionLevel = ZSTD_CLEVEL_DEFAULT;   /* should not matter, as all cParams are presumed properly defined */
    assert(!ZSTD_checkCParams(params.cParams));
    return ret;
}